

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
* anon_unknown.dwarf_21f9ed::ArchToolsetHelper
            (function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
             *__return_storage_ptr__,offset_in_ConfigurePreset_to_string valueField,
            offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
            strategyField)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  offset_in_ConfigurePreset_to_string *poVar2;
  Object<cmCMakePresetsGraph::ConfigurePreset> objectHelper;
  undefined1 local_78 [17];
  undefined8 uStack_67;
  undefined8 local_5c;
  bool local_54;
  string_view local_40;
  string_view local_30;
  
  local_78[0x10] = 0;
  uStack_67 = 0;
  local_78._0_8_ = (pointer)0x0;
  local_78[8] = 0;
  local_78._9_7_ = 0;
  local_5c._0_4_ = READ_OK;
  local_5c._4_4_ = INVALID_PRESET;
  local_54 = false;
  local_30._M_len = 5;
  local_30._M_str = "value";
  pOVar1 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
           Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::__cxx11::string,cmCMakePresetsGraph::ReadFileResult(*)(std::__cxx11::string&,Json::Value_const*)>
                     ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_78,&local_30,valueField,
                      cmCMakePresetsGraphInternal::PresetStringHelper,false);
  local_40._M_len = 8;
  local_40._M_str = "strategy";
  pOVar1 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
           Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>,cmCMakePresetsGraph::ReadFileResult(*)(std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>&,Json::Value_const*)>
                     (pOVar1,&local_40,strategyField,ArchToolsetStrategyHelper,false);
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::Object(&objectHelper,pOVar1);
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
             *)local_78);
  local_78[8] = (undefined1)strategyField;
  local_78._9_7_ = (undefined7)(strategyField >> 8);
  pOVar1 = (Object<cmCMakePresetsGraph::ConfigurePreset> *)(local_78 + 0x10);
  local_78._0_8_ = valueField;
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::Object(pOVar1,&objectHelper);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  poVar2 = (offset_in_ConfigurePreset_to_string *)operator_new(0x38);
  *poVar2 = local_78._0_8_;
  poVar2[1] = CONCAT71(local_78._9_7_,local_78[8]);
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)(poVar2 + 2),pOVar1);
  *(offset_in_ConfigurePreset_to_string **)
   &(__return_storage_ptr__->super__Function_base)._M_functor = poVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraphReadJSONConfigurePresets.cxx:62:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraphReadJSONConfigurePresets.cxx:62:10)>
       ::_M_manager;
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
             *)pOVar1);
  std::
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::ConfigurePreset>::Member>_>
  ::~vector(&objectHelper.Members);
  return __return_storage_ptr__;
}

Assistant:

std::function<ReadFileResult(ConfigurePreset&, const Json::Value*)>
ArchToolsetHelper(
  std::string ConfigurePreset::*valueField,
  cm::optional<ArchToolsetStrategy> ConfigurePreset::*strategyField)
{
  auto const objectHelper =
    JSONHelperBuilder::Object<ConfigurePreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET, false)
      .Bind("value", valueField,
            cmCMakePresetsGraphInternal::PresetStringHelper, false)
      .Bind("strategy", strategyField, ArchToolsetStrategyHelper, false);
  return [valueField, strategyField, objectHelper](
           ConfigurePreset& out, const Json::Value* value) -> ReadFileResult {
    if (!value) {
      (out.*valueField).clear();
      out.*strategyField = cm::nullopt;
      return ReadFileResult::READ_OK;
    }

    if (value->isString()) {
      out.*valueField = value->asString();
      out.*strategyField = cm::nullopt;
      return ReadFileResult::READ_OK;
    }

    if (value->isObject()) {
      return objectHelper(out, value);
    }

    return ReadFileResult::INVALID_PRESET;
  };
}